

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allintra_vis.c
# Opt level: O0

double get_max_scale(AV1_COMP *cpi,BLOCK_SIZE bsize,int mi_row,int mi_col)

{
  WeberStats *pWVar1;
  uint uVar2;
  int iVar3;
  WeberStats *weber_stats;
  int col;
  int row;
  double min_max_scale;
  int mb_stride;
  int mi_step;
  int mi_high;
  int mi_wide;
  AV1_COMMON *cm;
  int mi_col_local;
  int mi_row_local;
  BLOCK_SIZE bsize_local;
  AV1_COMP *cpi_local;
  
  uVar2 = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                [cpi->weber_bsize];
  min_max_scale = 10.0;
  for (row = mi_row; col = mi_col,
      row < (int)(mi_row + (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                                 [bsize]); row = uVar2 + row) {
    for (; col < (int)(mi_col + (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                                      [bsize]); col = uVar2 + col) {
      if ((((row < (cpi->common).mi_params.mi_rows) && (col < (cpi->common).mi_params.mi_cols)) &&
          (pWVar1 = cpi->mb_weber_stats,
          iVar3 = (row / (int)uVar2) * (cpi->frame_info).mi_cols + col / (int)uVar2,
          1.0 < pWVar1[iVar3].max_scale || pWVar1[iVar3].max_scale == 1.0)) &&
         (pWVar1[iVar3].max_scale < min_max_scale)) {
        min_max_scale = pWVar1[iVar3].max_scale;
      }
    }
  }
  return min_max_scale;
}

Assistant:

static double get_max_scale(const AV1_COMP *const cpi, BLOCK_SIZE bsize,
                            int mi_row, int mi_col) {
  const AV1_COMMON *const cm = &cpi->common;
  const int mi_wide = mi_size_wide[bsize];
  const int mi_high = mi_size_high[bsize];
  const int mi_step = mi_size_wide[cpi->weber_bsize];
  int mb_stride = cpi->frame_info.mi_cols;
  double min_max_scale = 10.0;

  for (int row = mi_row; row < mi_row + mi_high; row += mi_step) {
    for (int col = mi_col; col < mi_col + mi_wide; col += mi_step) {
      if (row >= cm->mi_params.mi_rows || col >= cm->mi_params.mi_cols)
        continue;
      const WeberStats *weber_stats =
          &cpi->mb_weber_stats[(row / mi_step) * mb_stride + (col / mi_step)];
      if (weber_stats->max_scale < 1.0) continue;
      if (weber_stats->max_scale < min_max_scale)
        min_max_scale = weber_stats->max_scale;
    }
  }
  return min_max_scale;
}